

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

unsigned_short * crnd::crnd_new_array<unsigned_short>(uint32 num)

{
  uint *puVar1;
  unsigned_short *p;
  uint8 *q;
  uint *puStack_10;
  uint32 num_local;
  
  q._4_4_ = num;
  if (num == 0) {
    q._4_4_ = 1;
  }
  puVar1 = (uint *)crnd_malloc((ulong)q._4_4_ * 2 + 8,(size_t *)0x0);
  if (puVar1 == (uint *)0x0) {
    puStack_10 = (uint *)0x0;
  }
  else {
    puStack_10 = puVar1 + 2;
    puVar1[1] = q._4_4_;
    *puVar1 = q._4_4_ ^ 0xffffffff;
    helpers::construct_array<unsigned_short>((unsigned_short *)puStack_10,q._4_4_);
  }
  return (unsigned_short *)puStack_10;
}

Assistant:

inline T* crnd_new_array(uint32 num)
    {
        if (!num)
            num = 1;

        uint8* q = static_cast<uint8*>(crnd_malloc(CRND_MIN_ALLOC_ALIGNMENT + sizeof(T) * num));
        if (!q)
            return NULL;

        T* p = reinterpret_cast<T*>(q + CRND_MIN_ALLOC_ALIGNMENT);

        reinterpret_cast<uint32*>(p)[-1] = num;
        reinterpret_cast<uint32*>(p)[-2] = ~num;

        helpers::construct_array(p, num);
        return p;
    }